

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::noteLocalType(BinaryInstWriter *this,Type type,Index count)

{
  mapped_type *pmVar1;
  mapped_type mVar2;
  key_type local_28;
  Type type_local;
  
  local_28.id = type.id;
  pmVar1 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->numLocalsByType,&local_28);
  mVar2 = *pmVar1;
  if (mVar2 == 0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(&this->localTypes,&local_28);
    mVar2 = *pmVar1;
  }
  *pmVar1 = count + mVar2;
  return;
}

Assistant:

void BinaryInstWriter::noteLocalType(Type type, Index count) {
  auto& num = numLocalsByType[type];
  if (num == 0) {
    localTypes.push_back(type);
  }
  num += count;
}